

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::RandomOrderTexImageCubeCase::createTexture
          (RandomOrderTexImageCubeCase *this)

{
  ContextWrapper *this_00;
  CubeFace CVar1;
  deUint32 format;
  deUint32 type;
  uint uVar2;
  deUint32 dVar3;
  CubeFace *pCVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int height;
  deUint32 tex;
  int local_104;
  vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> images;
  TextureFormat fmt;
  Random rnd;
  TextureLevel levelData;
  Vector<float,_4> local_88;
  Vec4 gMax;
  Vec4 gMin;
  PixelBufferAccess local_58;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    uVar7 = 1;
  }
  else {
    uVar7 = (this->super_TextureSpecCase).m_width;
    uVar2 = 0x20;
    uVar5 = uVar2;
    if (uVar7 != 0) {
      uVar5 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x1f;
    }
    uVar7 = (this->super_TextureSpecCase).m_height;
    if (uVar7 != 0) {
      uVar2 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    iVar8 = 0x1f - uVar2;
    if ((int)(0x1f - uVar2) < (int)(0x1f - uVar5)) {
      iVar8 = 0x1f - uVar5;
    }
    uVar7 = iVar8 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar3 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
  vector(&images,(ulong)(uVar7 * 6),(allocator_type *)&local_58);
  pCVar4 = &(images.
             super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second;
  for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
      pCVar4[lVar9 * 2 + -1] = (CubeFace)uVar6;
      pCVar4[lVar9 * 2] = (CubeFace)lVar9;
    }
    pCVar4 = pCVar4 + 0xc;
  }
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<std::pair<int,tcu::CubeFace>*,std::vector<std::pair<int,tcu::CubeFace>,std::allocator<std::pair<int,tcu::CubeFace>>>>>
            (&rnd,(__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
                   )images.
                    super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
              )images.
               super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  lVar9 = 0;
  while( true ) {
    if ((int)((ulong)((long)images.
                            super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)images.
                           super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar9) break;
    local_104 = images.
                super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar9].first;
    iVar8 = (this->super_TextureSpecCase).m_width >> ((byte)local_104 & 0x1f);
    if (iVar8 < 2) {
      iVar8 = 1;
    }
    height = (this->super_TextureSpecCase).m_height >> ((byte)local_104 & 0x1f);
    CVar1 = images.
            super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar9].second;
    if (height < 2) {
      height = 1;
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gMax,1.0);
    randomVector<4>((Functional *)&gMin,&rnd,(Vector<float,_4> *)&local_58,(Vector<float,_4> *)&gMax
                   );
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
    tcu::Vector<float,_4>::Vector(&local_88,1.0);
    randomVector<4>((Functional *)&gMax,&rnd,(Vector<float,_4> *)&local_58,&local_88);
    tcu::TextureLevel::setSize(&levelData,iVar8,height,1);
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    dVar3 = (&s_cubeMapFaces)[CVar1];
    format = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    sglr::ContextWrapper::glTexImage2D
              (this_00,dVar3,local_104,format,iVar8,height,0,format,type,
               local_58.super_ConstPixelBufferAccess.m_data);
    lVar9 = lVar9 + 1;
  }
  std::_Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
  ::~_Vector_base(&images.
                   super__Vector_base<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                 );
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Level-face pairs.
		vector<pair<int, tcu::CubeFace> >	images	(numLevels*6);

		for (int ndx = 0; ndx < numLevels; ndx++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				images[ndx*6 + face] = std::make_pair(ndx, (tcu::CubeFace)face);

		rnd.shuffle(images.begin(), images.end());

		for (int ndx = 0; ndx < (int)images.size(); ndx++)
		{
			int				levelNdx	= images[ndx].first;
			tcu::CubeFace	face		= images[ndx].second;
			int				levelW		= de::max(1, m_width >> levelNdx);
			int				levelH		= de::max(1, m_height >> levelNdx);
			Vec4			gMin		= randomVector<4>(rnd);
			Vec4			gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], levelNdx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}